

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdCofactoringGetVars(Kit_DsdNtk_t **ppNtk,int nSize,int *pVars)

{
  ushort uVar1;
  ushort uVar2;
  Kit_DsdNtk_t *pKVar3;
  Kit_DsdObj_t **ppKVar4;
  Kit_DsdObj_t *pKVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  if (nSize < 1) {
    uVar7 = 0;
  }
  else {
    uVar12 = 0;
    uVar7 = 0;
    do {
      pKVar3 = ppNtk[uVar12];
      uVar1 = pKVar3->nNodes;
      if (uVar1 != 0) {
        ppKVar4 = pKVar3->pNodes;
        uVar11 = 0;
        do {
          pKVar5 = ppKVar4[uVar11];
          if (pKVar5 == (Kit_DsdObj_t *)0x0) break;
          if ((((uint)*pKVar5 & 0xfc000000) != 0xc000000 && ((uint)*pKVar5 & 0x1c0) == 0x140) &&
             (0x3ffffff < (uint)*pKVar5)) {
            uVar2 = pKVar3->nVars;
            uVar13 = 0;
            do {
              uVar6 = *(ushort *)((long)&pKVar5[1].field_0x0 + uVar13 * 2) >> 1;
              uVar14 = (uint)uVar6;
              if ((uint)uVar2 + (uint)uVar1 <= uVar14) {
                __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                              ,0x9b,"int Kit_DsdLitIsLeaf(Kit_DsdNtk_t *, int)");
              }
              if (uVar6 < uVar2) {
                if ((int)uVar7 < 1) {
                  uVar9 = 0;
                }
                else {
                  uVar8 = 0;
                  do {
                    uVar9 = uVar8;
                    if (pVars[uVar8] == uVar14) break;
                    uVar8 = uVar8 + 1;
                    uVar9 = (ulong)uVar7;
                  } while (uVar7 != uVar8);
                }
                if ((uint)uVar9 == uVar7) {
                  lVar10 = (long)(int)uVar7;
                  uVar7 = uVar7 + 1;
                  pVars[lVar10] = uVar14;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (uint)*pKVar5 >> 0x1a);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)uVar1);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)nSize);
  }
  return uVar7;
}

Assistant:

int Kit_DsdCofactoringGetVars( Kit_DsdNtk_t ** ppNtk, int nSize, int * pVars )
{
    Kit_DsdObj_t * pObj;
    unsigned m;
    int i, k, v, Var, nVars, iFaninLit;
    // go through all the networks
    nVars = 0;
    for ( i = 0; i < nSize; i++ )
    {
        // go through the prime objects of each networks
        Kit_DsdNtkForEachObj( ppNtk[i], pObj, k )     
        {
            if ( pObj->Type != KIT_DSD_PRIME )
                continue;
            if ( pObj->nFans == 3 )
                continue;
            // collect direct fanin variables
            Kit_DsdObjForEachFanin( ppNtk[i], pObj, iFaninLit, m )
            {
                if ( !Kit_DsdLitIsLeaf(ppNtk[i], iFaninLit) )
                    continue;
                // add it to the array
                Var = Abc_Lit2Var( iFaninLit );
                for ( v = 0; v < nVars; v++ )
                    if ( pVars[v] == Var )
                        break;
                if ( v == nVars )
                    pVars[nVars++] = Var;
            }
        }
    }
    return nVars;
}